

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::CommandCompare::compareImagesRaw(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  ktx_uint32_t kVar1;
  uint uVar2;
  pointer pKVar3;
  void *__buf;
  size_t __nbytes;
  uint uVar4;
  undefined8 __n;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var8;
  long lVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  InputStreams *pIVar10;
  _Head_base<0UL,_unsigned_char_*,_false> _Var11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffers [2];
  ktxLevelIndexEntry entry;
  InputStreams *local_100;
  undefined1 local_f8 [8];
  uint32_t numLevels [2];
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  string local_88;
  ktx_uint64_t local_68;
  ktx_uint64_t kStack_60;
  undefined8 local_58;
  char *pcStack_50;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> local_48 [3];
  
  local_100 = streams;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)levelIndexEntry,"Image Data\n\n",(allocator<char> *)&entry);
  PrintDiff::setContext(diff,(string *)levelIndexEntry);
  std::__cxx11::string::~string((string *)levelIndexEntry);
  pKVar3 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  kVar1 = pKVar3->levelCount;
  numLevels[0] = kVar1 + (kVar1 == 0);
  uVar2 = pKVar3[1].levelCount;
  numLevels[1] = uVar2 + (uVar2 == 0);
  uVar4 = numLevels[1];
  if (uVar2 <= numLevels[0]) {
    uVar4 = numLevels[0];
  }
  _Var11._M_head_impl = (uchar *)0x0;
  do {
    if (_Var11._M_head_impl == (uchar *)(ulong)uVar4) {
      return;
    }
    levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
    super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged = false;
    levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
    super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged = false;
    pIVar10 = local_100;
    for (lVar9 = 3;
        __n = levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
              super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._M_value.byteLength,
        lVar9 != 0xb; lVar9 = lVar9 + 4) {
      if (_Var11._M_head_impl < (uchar *)(ulong)*(uint *)((long)numLevels + lVar9 + -3)) {
        local_58 = 0xf;
        pcStack_50 = "the level index";
        read(this,(int)pIVar10,(void *)((long)_Var11._M_head_impl * 0x18 + 0x50),(size_t)&entry);
        (&local_100)[lVar9] = (InputStreams *)entry.byteOffset;
        *(ktx_uint64_t *)(numLevels + lVar9 * 2 + -2) = entry.byteLength;
        *(ktx_uint64_t *)(numLevels + lVar9 * 2) = entry.uncompressedByteLength;
        if (*(char *)((long)&levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>
                             ._M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload
                     + lVar9 * 8) == '\0') {
          *(undefined1 *)
           ((long)&levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                   _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload +
           lVar9 * 8) = 1;
        }
      }
      pIVar10 = (InputStreams *)&pIVar10->field_0x3b8;
    }
    if (((levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
          super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged == false) ||
        (levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
         super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged != true)) ||
       (levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
        super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._M_value.byteLength !=
        levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
        super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._M_value.byteLength)) {
LAB_0012c494:
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0x19;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)buffers;
      buffers[0]._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var11._M_head_impl;
      ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"Mismatch in level {} data",fmt_00,args_00);
      sVar6 = local_88._M_string_length;
      _Var5._M_p = local_88._M_dataplus._M_p;
      fmt_01.size_ = 2;
      fmt_01.data_ = (char *)0x4;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_48;
      local_48[0].super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Head_base<0UL,_unsigned_char_*,_false>)
           (_Head_base<0UL,_unsigned_char_*,_false>)_Var11._M_head_impl;
      ::fmt::v10::vformat_abi_cxx11_((string *)buffers,(v10 *)"m={}",fmt_01,args_01);
      entry.byteOffset = sVar6;
      entry.byteLength = (ktx_uint64_t)_Var5._M_p;
      entry.uncompressedByteLength =
           (ktx_uint64_t)
           buffers[1]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      PrintDiff::operator<<(diff,(DiffMismatch *)&entry);
      std::__cxx11::string::~string((string *)buffers);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__(levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                          _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload.
                          _M_value.byteLength);
      local_f8 = (undefined1  [8])_Var11._M_head_impl;
      memset((void *)_Var8.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
      buffers[0]._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__(__n);
      memset((void *)_Var8.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,__n);
      buffers[1]._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      pIVar10 = local_100;
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        __buf = *(void **)((long)&levelIndexEntry[0].
                                  super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
                                  super__Optional_payload_base<ktxLevelIndexEntry>._M_payload +
                          lVar9 * 4);
        __nbytes = *(size_t *)
                    ((long)&buffers[0]._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar9);
        local_88._M_dataplus._M_p = (pointer)local_f8;
        fmt.size_ = 2;
        fmt.data_ = (char *)0xd;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v10::vformat_abi_cxx11_((string *)&entry,(v10 *)0x1cebf0,fmt,args);
        local_68 = entry.byteLength;
        kStack_60 = entry.byteOffset;
        read(this,(int)pIVar10,__buf,__nbytes);
        std::__cxx11::string::~string((string *)&entry);
        pIVar10 = (InputStreams *)&pIVar10->field_0x3b8;
      }
      iVar7 = bcmp((void *)buffers[0]._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   (void *)buffers[1]._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,__n);
      lVar9 = 8;
      do {
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   ((long)&buffers[0]._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar9));
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
      _Var11._M_head_impl = (uchar *)local_f8;
      if (iVar7 != 0) goto LAB_0012c494;
    }
    _Var11._M_head_impl = _Var11._M_head_impl + 1;
  } while( true );
}

Assistant:

void CommandCompare::compareImagesRaw(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Image Data\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        bool mismatch = false;

        // Missing levels are always considered a mismatch
        if (!levelIndexEntry[0].has_value() || !levelIndexEntry[1].has_value())
            mismatch = true;

        // Mismatching level data sizes are always considered a mismatch
        if (!mismatch && levelIndexEntry[0]->byteLength != levelIndexEntry[1]->byteLength)
            mismatch = true;

        if (!mismatch) {
            // If so far so good then load the level data and compare them
            std::unique_ptr<uint8_t[]> buffers[] = {
                std::make_unique<uint8_t[]>(levelIndexEntry[0]->byteLength),
                std::make_unique<uint8_t[]>(levelIndexEntry[1]->byteLength)
            };

            for (std::size_t i = 0; i < streams.size(); ++i)
                read(streams[i], levelIndexEntry[i]->byteOffset, buffers[i].get(),
                    levelIndexEntry[i]->byteLength, fmt::format("level {} data", level));

            if (std::memcmp(buffers[0].get(), buffers[1].get(), levelIndexEntry[0]->byteLength) != 0)
                mismatch = true;
        }

        if (mismatch)
            diff << DiffMismatch(fmt::format("Mismatch in level {} data", level), fmt::format("m={}", level));
    }
}